

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ae21a::optimizeWasm::OptimizeForJS::~OptimizeForJS(OptimizeForJS *this)

{
  OptimizeForJS *this_local;
  
  ~OptimizeForJS(this);
  operator_delete(this,0x108);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }